

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdpostct.c
# Opt level: O0

void start_pass_dpost(j_decompress_ptr cinfo,J_BUF_MODE pass_mode)

{
  long lVar1;
  undefined8 uVar2;
  int in_ESI;
  long *in_RDI;
  my_post_ptr post;
  
  lVar1 = in_RDI[0x47];
  if (in_ESI == 0) {
    if (*(int *)((long)in_RDI + 0x6c) == 0) {
      *(undefined8 *)(lVar1 + 8) = *(undefined8 *)(in_RDI[0x4c] + 8);
    }
    else {
      *(code **)(lVar1 + 8) = post_process_1pass;
      if (*(long *)(lVar1 + 0x18) == 0) {
        uVar2 = (**(code **)(in_RDI[1] + 0x38))
                          (in_RDI,*(undefined8 *)(lVar1 + 0x10),0,*(undefined4 *)(lVar1 + 0x20),1);
        *(undefined8 *)(lVar1 + 0x18) = uVar2;
      }
    }
  }
  else if (in_ESI == 2) {
    if (*(long *)(lVar1 + 0x10) == 0) {
      *(undefined4 *)(*in_RDI + 0x28) = 4;
      (**(code **)*in_RDI)(in_RDI);
    }
    *(code **)(lVar1 + 8) = post_process_2pass;
  }
  else if (in_ESI == 3) {
    if (*(long *)(lVar1 + 0x10) == 0) {
      *(undefined4 *)(*in_RDI + 0x28) = 4;
      (**(code **)*in_RDI)(in_RDI);
    }
    *(code **)(lVar1 + 8) = post_process_prepass;
  }
  else {
    *(undefined4 *)(*in_RDI + 0x28) = 4;
    (**(code **)*in_RDI)(in_RDI);
  }
  *(undefined4 *)(lVar1 + 0x28) = 0;
  *(undefined4 *)(lVar1 + 0x24) = 0;
  return;
}

Assistant:

METHODDEF(void)
start_pass_dpost(j_decompress_ptr cinfo, J_BUF_MODE pass_mode)
{
  my_post_ptr post = (my_post_ptr)cinfo->post;

  switch (pass_mode) {
  case JBUF_PASS_THRU:
    if (cinfo->quantize_colors) {
      /* Single-pass processing with color quantization. */
      post->pub.post_process_data = post_process_1pass;
      /* We could be doing buffered-image output before starting a 2-pass
       * color quantization; in that case, jinit_d_post_controller did not
       * allocate a strip buffer.  Use the virtual-array buffer as workspace.
       */
      if (post->buffer == NULL) {
        post->buffer = (*cinfo->mem->access_virt_sarray)
          ((j_common_ptr)cinfo, post->whole_image,
           (JDIMENSION)0, post->strip_height, TRUE);
      }
    } else {
      /* For single-pass processing without color quantization,
       * I have no work to do; just call the upsampler directly.
       */
      post->pub.post_process_data = cinfo->upsample->upsample;
    }
    break;
#ifdef QUANT_2PASS_SUPPORTED
  case JBUF_SAVE_AND_PASS:
    /* First pass of 2-pass quantization */
    if (post->whole_image == NULL)
      ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
    post->pub.post_process_data = post_process_prepass;
    break;
  case JBUF_CRANK_DEST:
    /* Second pass of 2-pass quantization */
    if (post->whole_image == NULL)
      ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
    post->pub.post_process_data = post_process_2pass;
    break;
#endif /* QUANT_2PASS_SUPPORTED */
  default:
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
    break;
  }
  post->starting_row = post->next_row = 0;
}